

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O2

int __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::SListLeaf::remove
          (SListLeaf *this,char *__filename)

{
  int extraout_EAX;
  SelectedSummand SStack_78;
  SelectedSummand local_48;
  
  Kernel::SelectedSummand::SelectedSummand(&SStack_78,(SelectedSummand *)__filename);
  Kernel::SelectedSummand::SelectedSummand(&local_48,&SStack_78);
  Lib::
  SkipList<Inferences::ALASCA::FourierMotzkinConf::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::LDComparator>
  ::remove<Inferences::ALASCA::FourierMotzkinConf::Rhs>(&this->_children,(Rhs *)&local_48);
  return extraout_EAX;
}

Assistant:

void remove(LeafData ld) override { _children.remove(ld); }